

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
::make_root(btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
            *this)

{
  bool bVar1;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
  *pbVar2;
  template_ElementType<0UL> *ppbVar3;
  
  pbVar2 = parent(this);
  bVar1 = is_root(pbVar2);
  if (bVar1) {
    pbVar2 = parent(this);
    pbVar2 = parent(pbVar2);
    ppbVar3 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::Less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,256,false>>
              ::GetField<0ul>((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::Less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,256,false>>
                               *)this);
    *ppbVar3 = pbVar2;
    return;
  }
  __assert_fail("parent()->is_root()",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                ,0x4ad,
                "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::Less<phmap::test_internal::MovableOnlyInstance>, std::allocator<phmap::test_internal::MovableOnlyInstance>, 256, false>>::make_root() [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::Less<phmap::test_internal::MovableOnlyInstance>, std::allocator<phmap::test_internal::MovableOnlyInstance>, 256, false>]"
               );
}

Assistant:

void make_root() {
            assert(parent()->is_root());
            set_parent(parent()->parent());
        }